

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int g_iofile(lua_State *L,int f,char *mode)

{
  int iVar1;
  lua_State *L_00;
  FILE **ppFVar2;
  FILE *pFVar3;
  lua_State *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  FILE **pf;
  char *filename;
  size_t *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int idx;
  undefined4 in_stack_fffffffffffffff0;
  int arg;
  
  idx = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  arg = (int)((ulong)in_RDI >> 0x20);
  iVar1 = lua_type((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (int)((ulong)in_RDX >> 0x20));
  if (0 < iVar1) {
    L_00 = (lua_State *)lua_tolstring(in_RDX,idx,in_stack_ffffffffffffffd8);
    if (L_00 == (lua_State *)0x0) {
      tofile((lua_State *)0x0);
      lua_pushvalue((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDX >> 0x20));
    }
    else {
      ppFVar2 = newfile(L_00);
      pFVar3 = fopen64((char *)L_00,(char *)in_RDX);
      *ppFVar2 = (FILE *)pFVar3;
      if (*ppFVar2 == (FILE *)0x0) {
        fileerror((lua_State *)pf,arg,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      }
    }
    lua_rawseti((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20)
                ,(int)in_RDX);
  }
  lua_rawgeti((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
              (int)in_RDX);
  return 1;
}

Assistant:

static int g_iofile(lua_State*L,int f,const char*mode){
if(!lua_isnoneornil(L,1)){
const char*filename=lua_tostring(L,1);
if(filename){
FILE**pf=newfile(L);
*pf=fopen(filename,mode);
if(*pf==NULL)
fileerror(L,1,filename);
}
else{
tofile(L);
lua_pushvalue(L,1);
}
lua_rawseti(L,(-10001),f);
}
lua_rawgeti(L,(-10001),f);
return 1;
}